

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O1

int pfx_table_del_elem(node_data *data,uint index)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined3 uVar7;
  rtr_socket *prVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  data_elem *pdVar13;
  long lVar14;
  long in_FS_OFFSET;
  data_elem deleted_elem;
  uint32_t local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 uVar6;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = (ulong)index;
  pdVar13 = data->ary + uVar12;
  uVar4 = pdVar13->asn;
  uVar5 = pdVar13->max_len;
  uVar7 = *(undefined3 *)&pdVar13->field_0x5;
  uVar6 = CONCAT31(uVar7,uVar5);
  prVar8 = pdVar13->socket;
  if ((data->len - 1 != index) && (index < data->len - 1)) {
    lVar14 = uVar12 << 4;
    do {
      uVar12 = uVar12 + 1;
      puVar1 = (undefined8 *)((long)&data->ary[1].asn + lVar14);
      uVar9 = puVar1[1];
      puVar2 = (undefined8 *)((long)&data->ary->asn + lVar14);
      *puVar2 = *puVar1;
      puVar2[1] = uVar9;
      lVar14 = lVar14 + 0x10;
    } while (uVar12 < data->len - 1);
  }
  uVar10 = data->len - 1;
  data->len = uVar10;
  if (uVar10 == 0) {
    lrtr_free(data->ary);
    data->ary = (data_elem *)0x0;
  }
  else {
    pdVar13 = (data_elem *)lrtr_realloc(data->ary,(ulong)uVar10 << 4);
    if (pdVar13 == (data_elem *)0x0) {
      uStack_20 = SUB84(prVar8,0);
      uStack_1c = (undefined4)((ulong)prVar8 >> 0x20);
      pdVar13 = data->ary + data->len;
      pdVar13->asn = uVar4;
      *(undefined4 *)&pdVar13->max_len = uVar6;
      *(undefined4 *)&pdVar13->socket = uStack_20;
      *(undefined4 *)((long)&pdVar13->socket + 4) = uStack_1c;
      data->len = data->len + 1;
      iVar11 = -1;
      goto LAB_00106749;
    }
    data->ary = pdVar13;
  }
  iVar11 = 0;
LAB_00106749:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return iVar11;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_del_elem(struct node_data *data, const unsigned int index)
{
	struct data_elem *tmp;
	struct data_elem deleted_elem = data->ary[index];

	// if index is not the last elem in the list, move all other elems backwards in the array
	if (index != data->len - 1) {
		for (unsigned int i = index; i < data->len - 1; i++)
			data->ary[i] = data->ary[i + 1];
	}

	data->len--;
	if (!data->len) {
		lrtr_free(data->ary);
		data->ary = NULL;
		return PFX_SUCCESS;
	}

	tmp = lrtr_realloc(data->ary, sizeof(struct data_elem) * data->len);
	if (!tmp) {
		data->ary[data->len] = deleted_elem;
		data->len++;
		return PFX_ERROR;
	}

	data->ary = tmp;

	return PFX_SUCCESS;
}